

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_inttable_next(upb_inttable *t,uintptr_t *key,upb_value *val,intptr_t *iter)

{
  long *plVar1;
  upb_tabent *puVar2;
  ulong uVar3;
  upb_value *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  _Bool _Var9;
  
  uVar6 = *iter;
  if ((ulong)t->array_size < uVar6 + 1) {
LAB_0029271f:
    uVar8 = (ulong)t->array_size;
    uVar5 = uVar6 - uVar8;
    uVar3 = (ulong)((t->t).mask + 1);
    lVar7 = uVar6 * 0x18 + uVar8 * -0x18 + 0x20;
    do {
      uVar5 = uVar5 + 1;
      if (uVar3 <= uVar5) {
        uVar5 = 0xfffffffffffffffe;
        break;
      }
      plVar1 = (long *)((long)&(((t->t).entries)->val).val + lVar7);
      lVar7 = lVar7 + 0x18;
    } while (*plVar1 == 0);
    _Var9 = uVar5 < uVar3;
    if (_Var9) {
      puVar2 = (t->t).entries;
      *key = (uintptr_t)puVar2[uVar5].key;
      val->val = puVar2[uVar5].val.val;
      uVar8 = uVar8 + uVar5;
    }
    else {
      uVar8 = 0x7ffffffffffffffe;
    }
  }
  else {
    do {
      uVar8 = uVar6 + 1;
      if (t->array_size <= uVar8) goto LAB_0029271f;
      puVar4 = inttable_array_get(t,uVar8);
      uVar6 = uVar8;
    } while (puVar4 == (upb_value *)0x0);
    *key = uVar8;
    val->val = puVar4->val;
    _Var9 = true;
  }
  *iter = uVar8;
  return _Var9;
}

Assistant:

bool upb_inttable_next(const upb_inttable* t, uintptr_t* key, upb_value* val,
                       intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)(i + 1) <= t->array_size) {
    while ((size_t)++i < t->array_size) {
      const upb_value* ent = inttable_array_get(t, i);
      if (ent) {
        *key = i;
        *val = *ent;
        *iter = i;
        return true;
      }
    }
    i--;  // Back up to exactly one position before the start of the table.
  }

  size_t tab_idx = next(&t->t, i - t->array_size);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = ent->key.num;
    *val = ent->val;
    *iter = tab_idx + t->array_size;
    return true;
  } else {
    // We should set the iterator any way. When we are done, the iterator value
    // is invalidated. `upb_inttable_done` will check on the iterator value to
    // determine if the iteration is done.
    *iter = INTPTR_MAX - 1;  // To disambiguate from UPB_INTTABLE_BEGIN, to
                             // match the behavior of `upb_strtable_iter`.
    return false;
  }
}